

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void backupUpdate(sqlite3_backup *p,Pgno iPage,u8 *aData)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  int rc;
  int in_stack_0000005c;
  u8 *in_stack_00000060;
  Pgno in_stack_0000006c;
  sqlite3_backup *in_stack_00000070;
  long local_8;
  
  local_8 = in_RDI;
  do {
    iVar1 = isFatalError(*(int *)(local_8 + 0x30));
    if ((iVar1 == 0) && (in_ESI < *(uint *)(local_8 + 0x18))) {
      sqlite3_mutex_enter((sqlite3_mutex *)0x16107b);
      iVar1 = backupOnePage(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_0000005c)
      ;
      sqlite3_mutex_leave((sqlite3_mutex *)0x1610a8);
      if (iVar1 != 0) {
        *(int *)(local_8 + 0x30) = iVar1;
      }
    }
    local_8 = *(long *)(local_8 + 0x40);
  } while (local_8 != 0);
  return;
}

Assistant:

static SQLITE_NOINLINE void backupUpdate(
  sqlite3_backup *p,
  Pgno iPage,
  const u8 *aData
){
  assert( p!=0 );
  do{
    assert( sqlite3_mutex_held(p->pSrc->pBt->mutex) );
    if( !isFatalError(p->rc) && iPage<p->iNext ){
      /* The backup process p has already copied page iPage. But now it
      ** has been modified by a transaction on the source pager. Copy
      ** the new data into the backup.
      */
      int rc;
      assert( p->pDestDb );
      sqlite3_mutex_enter(p->pDestDb->mutex);
      rc = backupOnePage(p, iPage, aData, 1);
      sqlite3_mutex_leave(p->pDestDb->mutex);
      assert( rc!=SQLITE_BUSY && rc!=SQLITE_LOCKED );
      if( rc!=SQLITE_OK ){
        p->rc = rc;
      }
    }
  }while( (p = p->pNext)!=0 );
}